

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O0

bool soul::isFollowedByBlankLine(CodeLocation *pos)

{
  byte bVar1;
  bool bVar2;
  byte local_d1;
  CodeLocation local_b8;
  string local_a8;
  string local_88;
  string local_58;
  string local_38;
  CodeLocation *local_18;
  CodeLocation *pos_local;
  
  local_18 = pos;
  CodeLocation::getSourceLine_abi_cxx11_(&local_58,pos);
  choc::text::trimEnd(&local_38,&local_58);
  bVar1 = std::__cxx11::string::empty();
  bVar2 = (bVar1 & 1) == 0;
  local_d1 = 1;
  if (bVar2) {
    CodeLocation::getStartOfNextLine(&local_b8);
    CodeLocation::getSourceLine_abi_cxx11_(&local_a8,&local_b8);
    choc::text::trimEnd(&local_88,&local_a8);
    local_d1 = std::__cxx11::string::empty();
  }
  pos_local._7_1_ = local_d1 & 1;
  if (bVar2) {
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    CodeLocation::~CodeLocation(&local_b8);
  }
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return (bool)(pos_local._7_1_ & 1);
}

Assistant:

static bool isFollowedByBlankLine (CodeLocation pos)
{
    return choc::text::trimEnd (pos.getSourceLine()).empty()
        || choc::text::trimEnd (pos.getStartOfNextLine().getSourceLine()).empty();
}